

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portmidi.c
# Opt level: O0

int pm_find_default_device(char *pattern,int is_input)

{
  char *pcVar1;
  PmDeviceInfo *pPVar2;
  PmDeviceInfo *info;
  char *name_pref;
  char *interf_pref;
  int i;
  int id;
  int is_input_local;
  char *pattern_local;
  
  name_pref = "";
  pcVar1 = strstr(pattern,", ");
  info = (PmDeviceInfo *)pattern;
  if (pcVar1 != (char *)0x0) {
    *pcVar1 = '\0';
    info = (PmDeviceInfo *)(pcVar1 + 2);
    name_pref = pattern;
  }
  interf_pref._4_4_ = 0;
  while( true ) {
    if (pm_descriptor_index <= interf_pref._4_4_) {
      return -1;
    }
    pPVar2 = Pm_GetDeviceInfo(interf_pref._4_4_);
    if (((pPVar2->input == is_input) &&
        (pcVar1 = strstr(pPVar2->name,(char *)info), pcVar1 != (char *)0x0)) &&
       (pcVar1 = strstr(pPVar2->interf,name_pref), pcVar1 != (char *)0x0)) break;
    interf_pref._4_4_ = interf_pref._4_4_ + 1;
  }
  return interf_pref._4_4_;
}

Assistant:

int pm_find_default_device(char *pattern, int is_input)
{
    int id = pmNoDevice;
    int i;
    /* first parse pattern into name, interf parts */
    char *interf_pref = ""; /* initially assume it is not there */
    char *name_pref = strstr(pattern, ", ");

    if (name_pref) { /* found separator, adjust the pointer */
        interf_pref = pattern;
        name_pref[0] = 0;
        name_pref += 2;
    } else {
        name_pref = pattern; /* whole string is the name pattern */
    }
    for (i = 0; i < pm_descriptor_index; i++) {
        const PmDeviceInfo *info = Pm_GetDeviceInfo(i);
        if (info->input == is_input &&
            strstr(info->name, name_pref) &&
            strstr(info->interf, interf_pref)) {
            id = i;
            break;
        }
    }    
    return id;
}